

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.h
# Opt level: O1

void __thiscall wallet::SQLiteBatch::~SQLiteBatch(SQLiteBatch *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ~SQLiteBatch(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(this,0x48);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~SQLiteBatch() override { Close(); }